

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int compute_huffman_codes(zbuf *a)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int c;
  int s;
  int hclen;
  int hdist;
  int hlit;
  int n;
  int i;
  uint8 codelength_sizes [19];
  uint8 lencodes [455];
  int in_stack_fffffffffffffdec;
  uint in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int local_200;
  int local_1fc;
  undefined1 local_1f8 [32];
  byte local_1d8 [100];
  int in_stack_fffffffffffffe8c;
  uint8 *in_stack_fffffffffffffe90;
  zhuffman *in_stack_fffffffffffffe98;
  int local_4;
  
  uVar1 = zreceive((zbuf *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffdec);
  iVar2 = uVar1 + 0x101;
  uVar1 = zreceive((zbuf *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffdec);
  iVar3 = uVar1 + 1;
  uVar1 = zreceive((zbuf *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffdec);
  iVar4 = uVar1 + 4;
  memset(local_1f8,0,0x13);
  for (local_1fc = 0; local_1fc < iVar4; local_1fc = local_1fc + 1) {
    in_stack_fffffffffffffdf0 =
         zreceive((zbuf *)CONCAT44(iVar4,in_stack_fffffffffffffdf0),in_stack_fffffffffffffdec);
    local_1f8[compute_huffman_codes::length_dezigzag[local_1fc]] = (char)in_stack_fffffffffffffdf0;
  }
  iVar5 = zbuild_huffman(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                         in_stack_fffffffffffffe8c);
  if (iVar5 == 0) {
    local_4 = 0;
  }
  else {
    local_200 = 0;
    while (local_200 < iVar2 + iVar3) {
      iVar5 = zhuffman_decode((zbuf *)CONCAT44(iVar2,iVar3),
                              (zhuffman *)CONCAT44(iVar4,in_stack_fffffffffffffdf0));
      if (iVar5 < 0x10) {
        local_1d8[local_200] = (byte)iVar5;
        local_200 = local_200 + 1;
      }
      else {
        if (iVar5 == 0x10) {
          uVar1 = zreceive((zbuf *)CONCAT44(iVar4,in_stack_fffffffffffffdf0),0x10);
          iVar5 = uVar1 + 3;
          memset(local_1d8 + local_200,(uint)local_1d8[local_200 + -1],(long)iVar5);
        }
        else if (iVar5 == 0x11) {
          uVar1 = zreceive((zbuf *)CONCAT44(iVar4,in_stack_fffffffffffffdf0),0x11);
          iVar5 = uVar1 + 3;
          memset(local_1d8 + local_200,0,(long)iVar5);
        }
        else {
          uVar1 = zreceive((zbuf *)CONCAT44(iVar4,in_stack_fffffffffffffdf0),iVar5);
          iVar5 = uVar1 + 0xb;
          memset(local_1d8 + local_200,0,(long)iVar5);
        }
        local_200 = iVar5 + local_200;
      }
    }
    if (local_200 == iVar2 + iVar3) {
      iVar2 = zbuild_huffman(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe8c);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        iVar2 = zbuild_huffman(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                               in_stack_fffffffffffffe8c);
        if (iVar2 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = e("Corrupt PNG");
    }
  }
  return local_4;
}

Assistant:

static int compute_huffman_codes(zbuf *a)
{
   static uint8 length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
   static zhuffman z_codelength; // static just to save stack space
   uint8 lencodes[286+32+137];//padding for maximum single op
   uint8 codelength_sizes[19];
   int i,n;

   int hlit  = zreceive(a,5) + 257;
   int hdist = zreceive(a,5) + 1;
   int hclen = zreceive(a,4) + 4;

   memset(codelength_sizes, 0, sizeof(codelength_sizes));
   for (i=0; i < hclen; ++i) {
      int s = zreceive(a,3);
      codelength_sizes[length_dezigzag[i]] = (uint8) s;
   }
   if (!zbuild_huffman(&z_codelength, codelength_sizes, 19)) return 0;

   n = 0;
   while (n < hlit + hdist) {
      int c = zhuffman_decode(a, &z_codelength);
      assert(c >= 0 && c < 19);
      if (c < 16)
         lencodes[n++] = (uint8) c;
      else if (c == 16) {
         c = zreceive(a,2)+3;
         memset(lencodes+n, lencodes[n-1], c);
         n += c;
      } else if (c == 17) {
         c = zreceive(a,3)+3;
         memset(lencodes+n, 0, c);
         n += c;
      } else {
         assert(c == 18);
         c = zreceive(a,7)+11;
         memset(lencodes+n, 0, c);
         n += c;
      }
   }
   if (n != hlit+hdist) return e("bad codelengths","Corrupt PNG");
   if (!zbuild_huffman(&a->z_length, lencodes, hlit)) return 0;
   if (!zbuild_huffman(&a->z_distance, lencodes+hlit, hdist)) return 0;
   return 1;
}